

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StripEH.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_150::StripEHImpl::~StripEHImpl(StripEHImpl *this)

{
  StripEHImpl *this_local;
  
  ~StripEHImpl(this);
  operator_delete(this,0x138);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }